

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void pool_destroy(pool_t pool_id)

{
  pool_info_t __ptr;
  int iVar1;
  ushort in_DI;
  int i;
  int num_blocks;
  pool_info_t pool;
  pool_t num_pools;
  int local_18;
  
  prf_array_count((void *)0x11aa48);
  __ptr = pools[in_DI];
  iVar1 = prf_array_count((void *)0x11aa70);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    free(__ptr->blocks[local_18]->data);
    free(__ptr->blocks[local_18]);
  }
  prf_array_free((void *)0x11aacc);
  free(__ptr);
  pools[in_DI] = (pool_info_t)0x0;
  return;
}

Assistant:

void
pool_destroy(
    pool_t pool_id )
{
    pool_t num_pools;
    pool_info_t pool;
    int num_blocks, i;

    num_pools = prf_array_count( pools );
    assert( (pool_id > 0) && (pool_id < num_pools));
    assert( pools[ pool_id ] != NULL );

    pool = pools[ pool_id ];
    num_blocks = prf_array_count( pool->blocks );
    for ( i = 0; i < num_blocks; i++ ) {
        free( pool->blocks[ i ]->data );
        free( pool->blocks[ i ] );
    }
    prf_array_free( pool->blocks );
    free( pool );
    pools[ pool_id ] = NULL;
}